

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O1

void __thiscall cppcms::http::context::make_error_message(context *this,exception *e)

{
  void **ppvVar1;
  response *this_00;
  char cVar2;
  bool bVar3;
  level_type lVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  service *this_01;
  cached_settings *pcVar9;
  ostringstream ss;
  undefined1 auStack_1f8 [8];
  string local_1f0;
  message local_1d0 [48];
  string local_1a0 [3];
  ios_base local_130 [264];
  
  lVar4 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar4,(char *)0x1e);
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_1d0,error,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
               ,0x150);
    poVar5 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Caught exception [",0x12);
    pcVar6 = (char *)(**(code **)(*(long *)e + 0x10))(e);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
    lVar8 = __dynamic_cast(e,&std::exception::typeinfo,&booster::backtrace::typeinfo,
                           0xfffffffffffffffe);
    if (lVar8 != 0) {
      ppvVar1 = *(void ***)(lVar8 + 8);
      if (ppvVar1 != *(void ***)(lVar8 + 0x10)) {
        booster::stack_trace::write_symbols
                  (ppvVar1,(int)((ulong)((long)*(void ***)(lVar8 + 0x10) - (long)ppvVar1) >> 3),
                   poVar5);
      }
    }
    if (cVar2 != '\0') {
      booster::log::message::~message(local_1d0);
    }
  }
  bVar3 = http::response::some_output_was_written
                    ((((this->d).ptr_)->response)._M_t.
                     super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                     .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  if (!bVar3) {
    this_01 = cppcms::impl::cgi::connection::service
                        ((this->conn_).
                         super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    pcVar9 = cppcms::service::cached_settings(this_01);
    if ((pcVar9->security).display_error_message == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      pcVar6 = (char *)(**(code **)(*(long *)e + 0x10))(e);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)auStack_1f8 +
                        (int)*(undefined8 *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 0x58);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,sVar7);
      }
      local_1f0._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_1f0,1);
      lVar8 = __dynamic_cast(e,&std::exception::typeinfo,&booster::backtrace::typeinfo,
                             0xfffffffffffffffe);
      if (lVar8 != 0) {
        ppvVar1 = *(void ***)(lVar8 + 8);
        if (ppvVar1 != *(void ***)(lVar8 + 0x10)) {
          booster::stack_trace::write_symbols
                    (ppvVar1,(int)((ulong)((long)*(void ***)(lVar8 + 0x10) - (long)ppvVar1) >> 3),
                     (ostream *)local_1a0);
        }
      }
      this_00 = (((this->d).ptr_)->response)._M_t.
                super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                ._M_t.
                super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl;
      std::__cxx11::stringbuf::str();
      http::response::make_error_response(this_00,500,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
          &local_1f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_))
        ;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    else {
      local_1a0[0]._M_string_length = 0;
      local_1a0[0].field_2._M_local_buf[0] = '\0';
      local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
      http::response::make_error_response
                ((((this->d).ptr_)->response)._M_t.
                 super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                 .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl,500,local_1a0)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
        operator_delete(local_1a0[0]._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void context::make_error_message(std::exception const &e)
{
	BOOSTER_ERROR("cppcms") << "Caught exception ["<<e.what()<<"]\n" << booster::trace(e)  ;
	if(!response().some_output_was_written()) {
		if(service().cached_settings().security.display_error_message) {
			std::ostringstream ss;
			ss << e.what() << '\n';
			ss << booster::trace(e);
			response().make_error_response(http::response::internal_server_error,ss.str());
		}
		else
			response().make_error_response(http::response::internal_server_error);
	}
}